

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation_test.cc
# Opt level: O0

void __thiscall
DebugAllocationTest_StackTraceWithDanglingWriteAtExitTest_Test::
DebugAllocationTest_StackTraceWithDanglingWriteAtExitTest_Test
          (DebugAllocationTest_StackTraceWithDanglingWriteAtExitTest_Test *this)

{
  DebugAllocationTest_StackTraceWithDanglingWriteAtExitTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__DebugAllocationTest_StackTraceWithDanglingWriteAtExitTest_Test_0019a6a8;
  return;
}

Assistant:

TEST(DebugAllocationTest, StackTraceWithDanglingWriteAtExitTest) {
  int *x = noopt(new int);
  FooBar::StackTraceMarker(x);
  int old_x_value = *x;
  *x = 1;
  if (!getenv("TCM_DEBUG_BT_SYMBOLIZATION_TEST")) {
    // verify that we also get a stack trace when we have a dangling write.
    // The " @ " is part of the stack trace output.
    EXPECT_DEATH(exit(0), " @ .*FooBar::StackTraceMarker");
    *x = old_x_value;  // restore x so that the test can exit successfully.
  } else {
    exit(0);
  }
}